

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DIS_Logger_Record.h
# Opt level: O2

void __thiscall
KDIS::UTILS::DIS_Logger_Record::Record<unsigned_int>
          (DIS_Logger_Record *this,uint Stamp,KDataStream *Stream)

{
  ostream *poVar1;
  KStringStream ss;
  KString KStack_1c8;
  stringstream local_1a8 [16];
  undefined1 local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  poVar1 = std::operator<<(poVar1,"\n");
  KDataStream::GetAsString_abi_cxx11_(&KStack_1c8,Stream);
  std::operator<<(poVar1,(string *)&KStack_1c8);
  std::__cxx11::string::~string((string *)&KStack_1c8);
  if (this->m_bWriteToFile == true) {
    std::__cxx11::stringbuf::str();
    writeToFile(this,&KStack_1c8);
  }
  else {
    std::__cxx11::stringbuf::str();
    writeToBuffer(this,&KStack_1c8);
  }
  std::__cxx11::string::~string((string *)&KStack_1c8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void DIS_Logger_Record::Record(Type Stamp, const KDataStream &Stream) noexcept(false)
{
    KStringStream ss;
    ss << Stamp << "\n" << Stream.GetAsString();
    m_bWriteToFile ? writeToFile( ss.str() ) : writeToBuffer( ss.str() );
}